

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image.c
# Opt level: O0

aom_image_t *
img_alloc_helper(aom_image_t *img,aom_img_fmt_t fmt,uint d_w,uint d_h,uint buf_align,
                uint stride_align,uint size_align,uint border,uchar *img_data,
                aom_alloc_img_data_cb_fn_t alloc_cb,void *cb_priv)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uchar *puVar6;
  uint in_ECX;
  uint in_EDX;
  aom_img_fmt_t in_ESI;
  aom_image_t *in_RDI;
  uint in_R8D;
  uint in_R9D;
  uint in_stack_00000008;
  uint in_stack_00000010;
  uchar *in_stack_00000018;
  code *in_stack_00000020;
  int ret;
  size_t padded_alloc_size;
  uint64_t alloc_size;
  int stride_in_bytes;
  uint64_t s;
  uint h;
  uint w;
  uint bit_depth;
  uint bps;
  uint ycs;
  uint xcs;
  ulong local_80;
  ulong local_78;
  aom_img_fmt_t aVar7;
  aom_img_fmt_t aVar8;
  aom_img_fmt_t aVar9;
  undefined4 in_stack_ffffffffffffff9c;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  aom_image_t *local_10;
  
  if (in_RDI != (aom_image_t *)0x0) {
    memset(in_RDI,0,0xa8);
  }
  if ((((in_ESI == AOM_IMG_FMT_NONE) || (0x8000000 < in_EDX)) || (0x8000000 < in_ECX)) ||
     (((0x10000 < in_R8D || (0x10000 < in_R9D)) ||
      ((0x10000 < in_stack_00000008 || (0x10000 < in_stack_00000010)))))) goto LAB_0018cd10;
  local_20 = in_R8D;
  if (in_R8D == 0) {
    local_20 = 1;
  }
  if ((local_20 & local_20 - 1) != 0) goto LAB_0018cd10;
  local_24 = in_R9D;
  if (in_R9D == 0) {
    local_24 = 1;
  }
  if ((local_24 & local_24 - 1) != 0) goto LAB_0018cd10;
  if (in_stack_00000008 == 0) {
    in_stack_00000008 = 1;
  }
  if ((in_stack_00000008 & in_stack_00000008 - 1) != 0) goto LAB_0018cd10;
  if ((in_ESI == AOM_IMG_FMT_I420) || (in_ESI == AOM_IMG_FMT_AOMI420)) {
LAB_0018c839:
    local_30 = 0xc;
  }
  else if (in_ESI == AOM_IMG_FMT_I422) {
    local_30 = 0x10;
  }
  else if (in_ESI == AOM_IMG_FMT_I444) {
    local_30 = 0x18;
  }
  else {
    if (((in_ESI == AOM_IMG_FMT_NV12) || (in_ESI == AOM_IMG_FMT_YV12)) ||
       (in_ESI == AOM_IMG_FMT_AOMYV12)) goto LAB_0018c839;
    if (in_ESI == AOM_IMG_FMT_I42016) {
LAB_0018c857:
      local_30 = 0x18;
    }
    else if (in_ESI == AOM_IMG_FMT_I42216) {
      local_30 = 0x20;
    }
    else if (in_ESI == AOM_IMG_FMT_I44416) {
      local_30 = 0x30;
    }
    else {
      if (in_ESI == AOM_IMG_FMT_YV1216) goto LAB_0018c857;
      local_30 = 0x10;
    }
  }
  uVar1 = (in_ESI >> 8 & 8) + 8;
  if ((((in_ESI == AOM_IMG_FMT_I420) || (in_ESI - AOM_IMG_FMT_AOMI420 < 2)) ||
      ((in_ESI == AOM_IMG_FMT_NV12 ||
       ((in_ESI == AOM_IMG_FMT_YV12 || (in_ESI == AOM_IMG_FMT_AOMYV12)))))) ||
     ((in_ESI == AOM_IMG_FMT_I42016 ||
      ((in_ESI == AOM_IMG_FMT_I42216 || (in_ESI == AOM_IMG_FMT_YV1216)))))) {
    local_28 = 1;
  }
  else {
    local_28 = 0;
  }
  if (((((in_ESI == AOM_IMG_FMT_I420) || (in_ESI == AOM_IMG_FMT_AOMI420)) ||
       (in_ESI == AOM_IMG_FMT_NV12)) ||
      ((in_ESI == AOM_IMG_FMT_YV12 || (in_ESI == AOM_IMG_FMT_AOMYV12)))) ||
     ((in_ESI == AOM_IMG_FMT_I42016 || (in_ESI == AOM_IMG_FMT_YV1216)))) {
    local_2c = 1;
  }
  else {
    local_2c = 0;
  }
  aVar7 = in_ESI;
  aVar8 = in_ESI;
  aVar9 = in_ESI;
  uVar2 = align_image_dimension(in_EDX,local_28,in_stack_00000008);
  uVar3 = align_image_dimension(in_ECX,local_2c,in_stack_00000008);
  local_78 = (ulong)uVar2 + (ulong)(in_stack_00000010 << 1);
  if ((in_ESI & 0x100) == AOM_IMG_FMT_NONE) {
    local_78 = (local_78 * local_30) / (ulong)uVar1;
  }
  uVar5 = ((local_78 * uVar1 >> 3) + (ulong)local_24) - 1 &
          ((ulong)local_24 - 1 ^ 0xffffffffffffffff);
  if (uVar5 < 0x80000000) {
    iVar4 = (int)uVar5;
    local_10 = in_RDI;
    if (in_RDI == (aom_image_t *)0x0) {
      local_10 = (aom_image_t *)calloc(1,0xa8);
      if (local_10 == (aom_image_t *)0x0) goto LAB_0018cd10;
      local_10->self_allocd = 1;
    }
    local_10->img_data = in_stack_00000018;
    if (in_stack_00000018 == (uchar *)0x0) {
      if ((in_ESI & 0x100) == AOM_IMG_FMT_NONE) {
        local_80 = (ulong)(uVar3 + in_stack_00000010 * 2) * (long)iVar4;
      }
      else {
        local_80 = ((ulong)(uVar3 + in_stack_00000010 * 2) * (long)iVar4 * (ulong)local_30) /
                   (ulong)uVar1;
      }
      if (in_stack_00000020 == (code *)0x0) {
        puVar6 = (uchar *)aom_memalign(CONCAT44(in_stack_ffffffffffffff9c,aVar9),
                                       CONCAT44(aVar8,aVar7));
        local_10->img_data = puVar6;
        local_10->img_data_owner = 1;
      }
      else {
        puVar6 = (uchar *)(*in_stack_00000020)(padded_alloc_size,local_80 + local_20 + -1);
        local_10->img_data = puVar6;
        if (local_10->img_data != (uchar *)0x0) {
          local_10->img_data =
               (uchar *)((ulong)(local_10->img_data + (local_20 - 1)) &
                        ((ulong)(local_20 - 1) ^ 0xffffffffffffffff));
        }
        local_10->img_data_owner = 0;
      }
      local_10->sz = local_80;
    }
    if (local_10->img_data != (uchar *)0x0) {
      local_10->fmt = in_ESI;
      local_10->bit_depth = uVar1;
      local_10->w = uVar2;
      local_10->h = uVar3;
      local_10->x_chroma_shift = local_28;
      local_10->y_chroma_shift = local_2c;
      local_10->bps = local_30;
      local_10->stride[0] = iVar4;
      iVar4 = iVar4 >> (sbyte)local_28;
      local_10->stride[2] = iVar4;
      local_10->stride[1] = iVar4;
      if (in_ESI == AOM_IMG_FMT_NV12) {
        local_10->stride[1] = local_10->stride[1] << 1;
        local_10->stride[2] = 0;
      }
      local_10->cp = AOM_CICP_CP_UNSPECIFIED;
      local_10->tc = AOM_CICP_TC_UNSPECIFIED;
      local_10->mc = AOM_CICP_MC_UNSPECIFIED;
      aom_img_set_rect(local_10,0,0,in_EDX,in_ECX,in_stack_00000010);
      return local_10;
    }
  }
LAB_0018cd10:
  aom_img_free((aom_image_t *)0x18cd1a);
  return (aom_image_t *)0x0;
}

Assistant:

static aom_image_t *img_alloc_helper(
    aom_image_t *img, aom_img_fmt_t fmt, unsigned int d_w, unsigned int d_h,
    unsigned int buf_align, unsigned int stride_align, unsigned int size_align,
    unsigned int border, unsigned char *img_data,
    aom_alloc_img_data_cb_fn_t alloc_cb, void *cb_priv) {
  /* NOTE: In this function, bit_depth is either 8 or 16 (if
   * AOM_IMG_FMT_HIGHBITDEPTH is set), never 10 or 12.
   */
  unsigned int xcs, ycs, bps, bit_depth;

  if (img != NULL) memset(img, 0, sizeof(aom_image_t));

  if (fmt == AOM_IMG_FMT_NONE) goto fail;

  /* Impose maximum values on input parameters so that this function can
   * perform arithmetic operations without worrying about overflows.
   */
  if (d_w > 0x08000000 || d_h > 0x08000000 || buf_align > 65536 ||
      stride_align > 65536 || size_align > 65536 || border > 65536) {
    goto fail;
  }

  /* Treat align==0 like align==1 */
  if (!buf_align) buf_align = 1;

  /* Validate alignment (must be power of 2) */
  if (buf_align & (buf_align - 1)) goto fail;

  /* Treat align==0 like align==1 */
  if (!stride_align) stride_align = 1;

  /* Validate alignment (must be power of 2) */
  if (stride_align & (stride_align - 1)) goto fail;

  /* Treat align==0 like align==1 */
  if (!size_align) size_align = 1;

  /* Validate alignment (must be power of 2) */
  if (size_align & (size_align - 1)) goto fail;

  /* Get sample size for this format */
  switch (fmt) {
    case AOM_IMG_FMT_I420:
    case AOM_IMG_FMT_YV12:
    case AOM_IMG_FMT_NV12:
    case AOM_IMG_FMT_AOMI420:
    case AOM_IMG_FMT_AOMYV12: bps = 12; break;
    case AOM_IMG_FMT_I422: bps = 16; break;
    case AOM_IMG_FMT_I444: bps = 24; break;
    case AOM_IMG_FMT_YV1216:
    case AOM_IMG_FMT_I42016: bps = 24; break;
    case AOM_IMG_FMT_I42216: bps = 32; break;
    case AOM_IMG_FMT_I44416: bps = 48; break;
    default: bps = 16; break;
  }

  bit_depth = (fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 16 : 8;

  /* Get chroma shift values for this format */
  switch (fmt) {
    case AOM_IMG_FMT_I420:
    case AOM_IMG_FMT_YV12:
    case AOM_IMG_FMT_NV12:
    case AOM_IMG_FMT_AOMI420:
    case AOM_IMG_FMT_AOMYV12:
    case AOM_IMG_FMT_I422:
    case AOM_IMG_FMT_I42016:
    case AOM_IMG_FMT_YV1216:
    case AOM_IMG_FMT_I42216: xcs = 1; break;
    default: xcs = 0; break;
  }

  switch (fmt) {
    case AOM_IMG_FMT_I420:
    case AOM_IMG_FMT_YV12:
    case AOM_IMG_FMT_NV12:
    case AOM_IMG_FMT_AOMI420:
    case AOM_IMG_FMT_AOMYV12:
    case AOM_IMG_FMT_YV1216:
    case AOM_IMG_FMT_I42016: ycs = 1; break;
    default: ycs = 0; break;
  }

  /* Calculate storage sizes given the chroma subsampling */
  const unsigned int w = align_image_dimension(d_w, xcs, size_align);
  assert(d_w <= w);
  const unsigned int h = align_image_dimension(d_h, ycs, size_align);
  assert(d_h <= h);

  uint64_t s = (uint64_t)w + 2 * border;
  s = (fmt & AOM_IMG_FMT_PLANAR) ? s : s * bps / bit_depth;
  s = s * bit_depth / 8;
  s = (s + stride_align - 1) & ~((uint64_t)stride_align - 1);
  if (s > INT_MAX) goto fail;
  const int stride_in_bytes = (int)s;

  /* Allocate the new image */
  if (!img) {
    img = (aom_image_t *)calloc(1, sizeof(aom_image_t));

    if (!img) goto fail;

    img->self_allocd = 1;
  }

  img->img_data = img_data;

  if (!img_data) {
    const uint64_t alloc_size =
        (fmt & AOM_IMG_FMT_PLANAR)
            ? (uint64_t)(h + 2 * border) * stride_in_bytes * bps / bit_depth
            : (uint64_t)(h + 2 * border) * stride_in_bytes;

    if (alloc_size != (size_t)alloc_size) goto fail;

    if (alloc_cb) {
      const size_t padded_alloc_size = (size_t)alloc_size + buf_align - 1;
      img->img_data = (uint8_t *)alloc_cb(cb_priv, padded_alloc_size);
      if (img->img_data) {
        img->img_data = (uint8_t *)aom_align_addr(img->img_data, buf_align);
      }
      img->img_data_owner = 0;
    } else {
      img->img_data = (uint8_t *)aom_memalign(buf_align, (size_t)alloc_size);
      img->img_data_owner = 1;
    }
    img->sz = (size_t)alloc_size;
  }

  if (!img->img_data) goto fail;

  img->fmt = fmt;
  img->bit_depth = bit_depth;
  // aligned width and aligned height
  img->w = w;
  img->h = h;
  img->x_chroma_shift = xcs;
  img->y_chroma_shift = ycs;
  img->bps = bps;

  /* Calculate strides */
  img->stride[AOM_PLANE_Y] = stride_in_bytes;
  img->stride[AOM_PLANE_U] = img->stride[AOM_PLANE_V] = stride_in_bytes >> xcs;

  if (fmt == AOM_IMG_FMT_NV12) {
    // Each row is a row of U and a row of V interleaved, so the stride is twice
    // as long.
    img->stride[AOM_PLANE_U] *= 2;
    img->stride[AOM_PLANE_V] = 0;
  }

  img->cp = AOM_CICP_CP_UNSPECIFIED;
  img->tc = AOM_CICP_TC_UNSPECIFIED;
  img->mc = AOM_CICP_MC_UNSPECIFIED;

  /* Default viewport to entire image. (This aom_img_set_rect call always
   * succeeds.) */
  int ret = aom_img_set_rect(img, 0, 0, d_w, d_h, border);
  assert(ret == 0);
  (void)ret;
  return img;

fail:
  aom_img_free(img);
  return NULL;
}